

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O2

IPCDeserializer * __thiscall
gnilk::IPCResultSummary::GetDeserializerForObject(IPCResultSummary *this,uint8_t idObject)

{
  undefined8 *puVar1;
  IPCDeserializer *pIVar2;
  undefined3 in_register_00000031;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000031,idObject);
  if (iVar3 == 0x83) {
    puVar1 = (undefined8 *)operator_new(0x30);
    pIVar2 = (IPCDeserializer *)(puVar1 + 1);
    *puVar1 = &PTR__IPCAssertError_0023cfe0;
    puVar1[1] = &PTR__IPCAssertError_0023d018;
    puVar1[2] = &PTR__AssertError_0023c770;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
  }
  else {
    if (iVar3 == 0x82) {
      this = (IPCResultSummary *)operator_new(0x60);
      (((IPCTestResults *)this)->super_IPCSerializer)._vptr_IPCSerializer = (_func_int **)0x0;
      (((IPCTestResults *)this)->super_IPCDeserializer).super_IPCObject._vptr_IPCObject =
           (_func_int **)0x0;
      (((IPCTestResults *)this)->symbolName)._M_dataplus._M_p = (pointer)0x0;
      (((IPCTestResults *)this)->symbolName)._M_string_length = 0;
      (((IPCTestResults *)this)->symbolName).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(((IPCTestResults *)this)->symbolName).field_2 + 8) = 0;
      (((IPCTestResults *)this)->testResult).
      super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (((IPCTestResults *)this)->testResult).
      super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (((IPCTestResults *)this)->assertError)._vptr_AssertError = (_func_int **)0x0;
      (((IPCTestResults *)this)->assertError).assertErrors.
      super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (((IPCTestResults *)this)->assertError).assertErrors.
      super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (((IPCTestResults *)this)->assertError).assertErrors.
      super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      IPCTestResults::IPCTestResults((IPCTestResults *)this);
    }
    else if (iVar3 != 0x80) {
      return (IPCDeserializer *)0x0;
    }
    pIVar2 = &((IPCTestResults *)this)->super_IPCDeserializer;
  }
  return pIVar2;
}

Assistant:

IPCDeserializer *IPCResultSummary::GetDeserializerForObject(uint8_t idObject) {
    switch(idObject) {
        case kMsgType_ResultSummary :
            return this;
        case kMsgType_TestResults :
            return (new IPCTestResults());
        case kMsgType_AssertError :
            return new IPCAssertError();
    }
    return nullptr;
}